

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schedule.hpp
# Opt level: O3

bool __thiscall Comparator::operator()(Comparator *this,ScheduleHandle *s1,ScheduleHandle *s2)

{
  Comparator CVar1;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  ulong uVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  pair<unsigned_long,_unsigned_long> pVar24;
  pair<unsigned_long,_unsigned_long> pVar25;
  ulong local_38;
  
  pVar24 = Schedule::analyze((s1->super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  pVar25 = Schedule::analyze((s2->super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  uVar2 = this->limit;
  bVar4 = pVar25.first <= uVar2;
  if (pVar24.first <= uVar2 == bVar4) {
    if (uVar2 < pVar24.first) {
      pVar24 = Schedule::analyze((s1->super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>).
                                 _M_ptr);
      CVar1 = *this;
      uVar5 = CVar1.limit;
      pVar25 = Schedule::analyze((s2->super___shared_ptr<Schedule,_(__gnu_cxx::_Lock_policy)2>).
                                 _M_ptr);
      auVar10._8_8_ = pVar25.first;
      auVar10._0_8_ = pVar24.first;
      uVar2 = this->limit;
      auVar21._8_8_ = uVar2;
      auVar21._0_8_ = uVar5;
      auVar12 = auVar21 ^ _DAT_00134070;
      auVar10 = _DAT_00134070 ^ auVar10;
      iVar13 = -(uint)(auVar12._0_4_ < auVar10._0_4_);
      iVar14 = -(uint)(auVar12._4_4_ < auVar10._4_4_);
      iVar15 = -(uint)(auVar12._8_4_ < auVar10._8_4_);
      iVar16 = -(uint)(auVar12._12_4_ < auVar10._12_4_);
      auVar11._4_4_ = -(uint)(auVar10._4_4_ == auVar12._4_4_);
      auVar11._12_4_ = -(uint)(auVar10._12_4_ == auVar12._12_4_);
      auVar11._0_4_ = auVar11._4_4_;
      auVar11._8_4_ = auVar11._12_4_;
      auVar12._4_4_ = iVar13;
      auVar12._0_4_ = iVar13;
      auVar12._8_4_ = iVar15;
      auVar12._12_4_ = iVar15;
      auVar17._4_4_ = iVar14;
      auVar17._0_4_ = iVar14;
      auVar17._8_4_ = iVar16;
      auVar17._12_4_ = iVar16;
      auVar17 = auVar17 | auVar11 & auVar12;
      auVar7._0_8_ = pVar24.first - uVar5;
      auVar7._8_8_ = pVar25.first - uVar2;
      auVar12 = auVar7 & _DAT_00134080 | _DAT_00134090;
      auVar8._0_8_ = ((double)(auVar7._0_8_ >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25)
                     + auVar12._0_8_;
      auVar8._8_8_ = ((double)(auVar7._8_8_ >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25)
                     + auVar12._8_8_;
      auVar12 = auVar21 & _DAT_00134080 | _DAT_00134090;
      auVar22._0_8_ =
           ((double)(uVar5 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) + auVar12._0_8_;
      auVar22._8_8_ =
           ((double)(uVar2 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) + auVar12._8_8_;
      auVar12 = divpd(auVar8,auVar22);
      uVar2 = this->origin_time;
      local_38 = CVar1.origin_time;
      auVar23._8_8_ = uVar2;
      auVar23._0_8_ = local_38;
      auVar18._0_8_ = pVar24.second - local_38;
      auVar18._8_8_ = pVar25.second - uVar2;
      auVar10 = auVar18 & _DAT_00134080 | _DAT_00134090;
      auVar19._0_8_ =
           ((double)(auVar18._0_8_ >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
           auVar10._0_8_;
      auVar19._8_8_ =
           ((double)(auVar18._8_8_ >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
           auVar10._8_8_;
      auVar10 = _DAT_00134080 & auVar23 | _DAT_00134090;
      auVar20._0_8_ =
           ((double)(local_38 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
           auVar10._0_8_;
      auVar20._8_8_ =
           ((double)(uVar2 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) + auVar10._8_8_;
      auVar10 = divpd(auVar19,auVar20);
      dVar6 = (double)(auVar12._0_8_ & auVar17._0_8_) * 0.6 + auVar10._0_8_ * 0.4;
      dVar9 = (double)(auVar12._8_8_ & auVar17._8_8_) * 0.6 + auVar10._8_8_ * 0.4;
      bVar4 = dVar6 == dVar9;
      bVar3 = dVar6 < dVar9;
    }
    else {
      bVar3 = pVar24.second < pVar25.second;
      bVar4 = pVar24.second == pVar25.second;
    }
    bVar4 = !bVar3 && !bVar4;
  }
  return bVar4;
}

Assistant:

bool operator () (const ScheduleHandle &s1, const ScheduleHandle &s2) const {
        // Whether reaching limit
        size_t s1_peak_memory, s2_peak_memory;
        uint64_t s1_total_time, s2_total_time;
        std::tie(s1_peak_memory, s1_total_time) = s1->analyze();
        std::tie(s2_peak_memory, s2_total_time) = s2->analyze();
        if ((s1_peak_memory <= limit) != (s2_peak_memory <= limit)) {
            return s2_peak_memory <= limit;
        } else if (s1_peak_memory <= limit) {
            return s1_total_time > s2_total_time;
        }

        // Compare both time and memory
        return score(s1) > score(s2);
    }